

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBreakCommand.cxx
# Opt level: O0

bool __thiscall
cmBreakCommand::InitialPass
          (cmBreakCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  MessageType MVar2;
  bool bVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  string local_3c8;
  string local_3a8;
  MessageType local_384;
  undefined1 local_380 [4];
  MessageType messageType_1;
  ostringstream e_1;
  undefined1 local_200 [3];
  bool issueMessage_1;
  string local_1e0;
  MessageType local_1ac;
  undefined1 local_1a8 [4];
  MessageType messageType;
  ostringstream e;
  bool issueMessage;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmBreakCommand *this_local;
  
  bVar3 = cmMakefile::IsLoopBlock((this->super_cmCommand).Makefile);
  if (!bVar3) {
    bVar3 = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_1ac = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0055,false);
    if (PVar4 == OLD) {
      bVar3 = false;
    }
    else if (PVar4 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0x37,id);
      poVar5 = std::operator<<((ostream *)local_1a8,(string *)&local_1e0);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    else if (PVar4 - NEW < 3) {
      local_1ac = FATAL_ERROR;
    }
    if (bVar3) {
      std::operator<<((ostream *)local_1a8,
                      "A BREAK command was found outside of a proper FOREACH or WHILE loop scope.");
      MVar2 = local_1ac;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,MVar2,(string *)local_200);
      std::__cxx11::string::~string((string *)local_200);
      if (local_1ac != FATAL_ERROR) goto LAB_001cc1b0;
      this_local._7_1_ = 0;
      bVar3 = true;
    }
    else {
LAB_001cc1b0:
      bVar3 = false;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    if (bVar3) goto LAB_001cc402;
  }
  cmExecutionStatus::SetBreakInvoked(status);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (!bVar3) {
    bVar3 = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
    local_384 = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0055,false);
    if (PVar4 == OLD) {
      bVar3 = false;
    }
    else if (PVar4 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_3a8,(cmPolicies *)0x37,id_00);
      poVar5 = std::operator<<((ostream *)local_380,(string *)&local_3a8);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_3a8);
    }
    else if (PVar4 - NEW < 3) {
      local_384 = FATAL_ERROR;
    }
    if (bVar3) {
      std::operator<<((ostream *)local_380,"The BREAK command does not accept any arguments.");
      MVar2 = local_384;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,MVar2,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      if (local_384 != FATAL_ERROR) goto LAB_001cc3ca;
      this_local._7_1_ = 0;
      bVar3 = true;
    }
    else {
LAB_001cc3ca:
      bVar3 = false;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
    if (bVar3) goto LAB_001cc402;
  }
  this_local._7_1_ = 1;
LAB_001cc402:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBreakCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (!this->Makefile->IsLoopBlock()) {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0055)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "A BREAK command was found outside of a proper "
           "FOREACH or WHILE loop scope.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  status.SetBreakInvoked();

  if (!args.empty()) {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0055)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "The BREAK command does not accept any arguments.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  return true;
}